

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionFixtureSetTargetMsgSeqNumHelper::RunImpl
          (sessionFixtureSetTargetMsgSeqNumHelper *this)

{
  TestResults *results;
  Session *pSVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_38;
  int expectedMessageSeq;
  TestDetails local_30;
  
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0xffffffff);
  expectedMessageSeq = 0x19;
  FIX::SessionState::setNextTargetMsgSeqNum
            ((SessionState *)((this->super_sessionFixture).object + 0x250),0x19);
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  pSVar1 = (this->super_sessionFixture).object;
  local_38 = (**(code **)(*(long *)(pSVar1 + 0x250) + 0x28))(pSVar1 + 0x250);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_30,*ppTVar3,0x645);
  UnitTest::CheckEqual<int,int>(results,&expectedMessageSeq,&local_38,&local_30);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SetTargetMsgSeqNum) {
  createSession(1);
  int expectedMessageSeq = 25;
  object->setNextTargetMsgSeqNum(expectedMessageSeq);
  CHECK_EQUAL(expectedMessageSeq, object->getStore()->getNextTargetMsgSeqNum());
}